

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cbtDbvtBroadphase.cpp
# Opt level: O1

void __thiscall
cbtDbvtBroadphase::setAabbForceUpdate
          (cbtDbvtBroadphase *this,cbtBroadphaseProxy *absproxy,cbtVector3 *aabbMin,
          cbtVector3 *aabbMax,cbtDispatcher *param_4)

{
  cbtScalar cVar1;
  undefined8 uVar2;
  cbtDbvtNode *pcVar3;
  cbtDbvtVolume aabb;
  cbtDbvtTreeCollider collider;
  cbtDbvtVolume local_68;
  ICollide local_40;
  cbtDbvtBroadphase *local_38;
  
  local_68.mi.m_floats._0_8_ = *(undefined8 *)aabbMin->m_floats;
  local_68.mi.m_floats._8_8_ = *(undefined8 *)(aabbMin->m_floats + 2);
  local_68.mx.m_floats._0_8_ = *(undefined8 *)aabbMax->m_floats;
  local_68.mx.m_floats._8_8_ = *(undefined8 *)(aabbMax->m_floats + 2);
  if (absproxy[1].m_aabbMin.m_floats[1] == 2.8026e-45) {
    cbtDbvt::remove((cbtDbvt *)&this->field_0x48,(char *)absproxy[1].m_clientObject);
    pcVar3 = cbtDbvt::insert((cbtDbvt *)&this->field_0x8,&local_68,absproxy);
    absproxy[1].m_clientObject = pcVar3;
  }
  else {
    this->m_updates_call = this->m_updates_call + 1;
    cbtDbvt::update((cbtDbvt *)&this->field_0x8,(cbtDbvtNode *)absproxy[1].m_clientObject,&local_68)
    ;
    this->m_updates_done = this->m_updates_done + 1;
  }
  if (*(long *)&absproxy[1].m_collisionFilterGroup == 0) {
    this->m_stageRoots[(int)absproxy[1].m_aabbMin.m_floats[1]] =
         *(cbtDbvtProxy **)&absproxy[1].m_uniqueId;
  }
  else {
    *(undefined8 *)(*(long *)&absproxy[1].m_collisionFilterGroup + 0x48) =
         *(undefined8 *)&absproxy[1].m_uniqueId;
  }
  if (*(long *)&absproxy[1].m_uniqueId != 0) {
    *(undefined8 *)(*(long *)&absproxy[1].m_uniqueId + 0x40) =
         *(undefined8 *)&absproxy[1].m_collisionFilterGroup;
  }
  uVar2 = *(undefined8 *)(aabbMin->m_floats + 2);
  *(undefined8 *)(absproxy->m_aabbMin).m_floats = *(undefined8 *)aabbMin->m_floats;
  *(undefined8 *)((absproxy->m_aabbMin).m_floats + 2) = uVar2;
  uVar2 = *(undefined8 *)(aabbMax->m_floats + 2);
  *(undefined8 *)(absproxy->m_aabbMax).m_floats = *(undefined8 *)aabbMax->m_floats;
  *(undefined8 *)((absproxy->m_aabbMax).m_floats + 2) = uVar2;
  cVar1 = (cbtScalar)this->m_stageCurrent;
  absproxy[1].m_aabbMin.m_floats[1] = cVar1;
  absproxy[1].m_collisionFilterGroup = 0;
  absproxy[1].m_collisionFilterMask = 0;
  *(cbtDbvtProxy **)&absproxy[1].m_uniqueId = this->m_stageRoots[(int)cVar1];
  if (this->m_stageRoots[(int)cVar1] != (cbtDbvtProxy *)0x0) {
    this->m_stageRoots[(int)cVar1]->links[0] = (cbtDbvtProxy *)absproxy;
  }
  this->m_stageRoots[(int)cVar1] = (cbtDbvtProxy *)absproxy;
  this->m_needcleanup = true;
  if (this->m_deferedcollide == false) {
    local_40._vptr_ICollide = (_func_int **)&PTR__ICollide_00b6f860;
    local_38 = this;
    cbtDbvt::collideTTpersistentStack
              ((cbtDbvt *)&this->field_0x48,*(cbtDbvtNode **)&this->field_0x48,
               (cbtDbvtNode *)absproxy[1].m_clientObject,&local_40);
    cbtDbvt::collideTTpersistentStack
              ((cbtDbvt *)&this->field_0x8,*(cbtDbvtNode **)&this->field_0x8,
               (cbtDbvtNode *)absproxy[1].m_clientObject,&local_40);
  }
  return;
}

Assistant:

void cbtDbvtBroadphase::setAabbForceUpdate(cbtBroadphaseProxy* absproxy,
										  const cbtVector3& aabbMin,
										  const cbtVector3& aabbMax,
										  cbtDispatcher* /*dispatcher*/)
{
	cbtDbvtProxy* proxy = (cbtDbvtProxy*)absproxy;
	ATTRIBUTE_ALIGNED16(cbtDbvtVolume)
	aabb = cbtDbvtVolume::FromMM(aabbMin, aabbMax);
	bool docollide = false;
	if (proxy->stage == STAGECOUNT)
	{ /* fixed -> dynamic set	*/
		m_sets[1].remove(proxy->leaf);
		proxy->leaf = m_sets[0].insert(aabb, proxy);
		docollide = true;
	}
	else
	{ /* dynamic set				*/
		++m_updates_call;
		/* Teleporting			*/
		m_sets[0].update(proxy->leaf, aabb);
		++m_updates_done;
		docollide = true;
	}
	listremove(proxy, m_stageRoots[proxy->stage]);
	proxy->m_aabbMin = aabbMin;
	proxy->m_aabbMax = aabbMax;
	proxy->stage = m_stageCurrent;
	listappend(proxy, m_stageRoots[m_stageCurrent]);
	if (docollide)
	{
		m_needcleanup = true;
		if (!m_deferedcollide)
		{
			cbtDbvtTreeCollider collider(this);
			m_sets[1].collideTTpersistentStack(m_sets[1].m_root, proxy->leaf, collider);
			m_sets[0].collideTTpersistentStack(m_sets[0].m_root, proxy->leaf, collider);
		}
	}
}